

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void callStatGet(Vdbe *v,int regStat4,int iParam,int regOut)

{
  int addr;
  
  sqlite3VdbeAddOp3(v,0x46,iParam,regStat4 + 1,0);
  addr = sqlite3VdbeAddOp3(v,0x3f,0,regStat4,regOut);
  sqlite3VdbeChangeP4(v,addr,&statGetFuncdef.nArg,-8);
  if (0 < (long)v->nOp) {
    v->aOp[(long)v->nOp + -1].p5 = 2;
  }
  return;
}

Assistant:

static void callStatGet(Vdbe *v, int regStat4, int iParam, int regOut){
  assert( regOut!=regStat4 && regOut!=regStat4+1 );
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  sqlite3VdbeAddOp2(v, OP_Integer, iParam, regStat4+1);
#elif SQLITE_DEBUG
  assert( iParam==STAT_GET_STAT1 );
#else
  UNUSED_PARAMETER( iParam );
#endif
  sqlite3VdbeAddOp4(v, OP_Function0, 0, regStat4, regOut,
                    (char*)&statGetFuncdef, P4_FUNCDEF);
  sqlite3VdbeChangeP5(v, 1 + IsStat34);
}